

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_set_null(JSON_Object *object,char *name)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  JSON_Status status;
  JSON_Value *value;
  char *name_local;
  JSON_Object *object_local;
  
  value_00 = json_value_init_null();
  JVar1 = json_object_set_value(object,name,value_00);
  if (JVar1 != 0) {
    json_value_free(value_00);
  }
  return JVar1;
}

Assistant:

JSON_Status json_object_set_null(JSON_Object *object, const char *name) {
    JSON_Value *value = json_value_init_null();
    JSON_Status status = json_object_set_value(object, name, value);
    if (status != JSONSuccess) {
        json_value_free(value);
    }
    return status;
}